

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::StructUnionMemberSyntax> *args_6;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *args_8;
  StructUnionTypeSyntax *pSVar1;
  Token local_90;
  Token local_80;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_80 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  local_90 = parsing::Token::deepClone((Token *)(__fn + 0x38),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x48),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  args_6 = deepClone<slang::syntax::StructUnionMemberSyntax>
                     ((SyntaxList<slang::syntax::StructUnionMemberSyntax> *)(__fn + 0x68),
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0xa0),(BumpAllocator *)__child_stack);
  args_8 = deepClone<slang::syntax::VariableDimensionSyntax>
                     ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)(__fn + 0xb0),
                      (BumpAllocator *)__child_stack);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::StructUnionTypeSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::StructUnionMemberSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_70,&local_80,
                      &local_90,&local_40,&local_50,args_6,&local_60,args_8);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const StructUnionTypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<StructUnionTypeSyntax>(
        node.kind,
        node.keyword.deepClone(alloc),
        node.taggedOrSoft.deepClone(alloc),
        node.packed.deepClone(alloc),
        node.signing.deepClone(alloc),
        node.openBrace.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.closeBrace.deepClone(alloc),
        *deepClone(node.dimensions, alloc)
    );
}